

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O3

string * searchFilenameInRpaths
                   (string *__return_storage_ptr__,string *rpath_file,string *dependent_file)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  uint uVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  long *plVar8;
  char *pcVar9;
  size_type *psVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar11;
  pointer pbVar12;
  uint uVar13;
  Settings *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rpath;
  string suffix;
  anon_class_24_3_7b6e7f73 check_path;
  char buffer [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1100;
  string *local_10e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1098;
  anon_class_24_3_7b6e7f73 local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  string local_1058;
  char local_1038 [4104];
  
  local_1098 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1098;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1100,"^@[a-z_]+path/",
             0x10);
  local_10d8._M_dataplus._M_p = (pointer)&local_10d8.field_2;
  local_10d8._M_string_length = 0;
  local_10d8.field_2._M_local_buf[0] = '\0';
  __first._M_current = (rpath_file->_M_dataplus)._M_p;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            (&local_10d8,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + rpath_file->_M_string_length),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1100,"",0,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1100);
  local_10e0 = rpath_file;
  local_1090.dependent_file = dependent_file;
  local_1090.rpath_file = rpath_file;
  local_1090.fullpath = __return_storage_ptr__;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&rpath_to_fullpath_abi_cxx11_._M_t,rpath_file);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &rpath_to_fullpath_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    pcVar1 = (local_10e0->_M_dataplus)._M_p;
    local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1058,pcVar1,pcVar1 + local_10e0->_M_string_length);
    bVar3 = searchFilenameInRpaths::anon_class_24_3_7b6e7f73::operator()(&local_1090,&local_1058);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
      operator_delete(local_1058._M_dataplus._M_p);
    }
    if (bVar3) goto LAB_00107f13;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&rpaths_per_file_abi_cxx11_,dependent_file);
    pbVar12 = (pmVar6->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pmVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar12 != pbVar2) {
      do {
        pcVar1 = (pbVar12->_M_dataplus)._M_p;
        local_1100._M_dataplus._M_p = (pointer)&local_1100.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1100,pcVar1,pcVar1 + pbVar12->_M_string_length);
        if (local_1100._M_dataplus._M_p[local_1100._M_string_length - 1] != '/') {
          std::__cxx11::string::append((char *)&local_1100);
        }
        std::operator+(&local_1078,&local_1100,&local_10d8);
        bVar3 = searchFilenameInRpaths::anon_class_24_3_7b6e7f73::operator()
                          (&local_1090,&local_1078);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
          operator_delete(local_1078._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
          operator_delete(local_1100._M_dataplus._M_p);
        }
        pbVar12 = pbVar12 + 1;
      } while (!bVar3 && pbVar12 != pbVar2);
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&rpath_to_fullpath_abi_cxx11_._M_t,local_10e0);
    if ((_Rb_tree_header *)iVar5._M_node ==
        &rpath_to_fullpath_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) goto LAB_00107f13;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&rpath_to_fullpath_abi_cxx11_,local_10e0);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_00107f13:
  if (__return_storage_ptr__->_M_string_length == 0) {
    uVar4 = Settings::searchPathAmount();
    if (0 < (int)uVar4) {
      this = (Settings *)0x0;
      uVar11 = extraout_RDX;
      do {
        Settings::searchPath_abi_cxx11_(&local_1100,this,(int)uVar11);
        std::operator+(&local_10b8,&local_1100,&local_10d8);
        bVar3 = fileExists(&local_10b8);
        uVar11 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
          operator_delete(local_10b8._M_dataplus._M_p);
          uVar11 = extraout_RDX_01;
        }
        if (bVar3) {
          std::operator+(&local_10b8,&local_1100,&local_10d8);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_10b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
            operator_delete(local_10b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
            operator_delete(local_1100._M_dataplus._M_p);
          }
          break;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
          operator_delete(local_1100._M_dataplus._M_p);
          uVar11 = extraout_RDX_02;
        }
        uVar13 = (int)this + 1;
        this = (Settings *)(ulong)uVar13;
      } while (uVar4 != uVar13);
    }
    if (__return_storage_ptr__->_M_string_length == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\n/!\\ WARNING : can\'t get path for \'",0x23);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(local_10e0->_M_dataplus)._M_p,
                          local_10e0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
      getUserInputDirForFile(&local_10b8,&local_10d8);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_10b8,(ulong)local_10d8._M_dataplus._M_p);
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1100.field_2._M_allocated_capacity = *psVar10;
        local_1100.field_2._8_8_ = plVar8[3];
        local_1100._M_dataplus._M_p = (pointer)&local_1100.field_2;
      }
      else {
        local_1100.field_2._M_allocated_capacity = *psVar10;
        local_1100._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1100._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
        operator_delete(local_1100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
        operator_delete(local_10b8._M_dataplus._M_p);
      }
      pcVar9 = realpath((__return_storage_ptr__->_M_dataplus)._M_p,local_1038);
      if (pcVar9 != (char *)0x0) {
        pcVar9 = (char *)__return_storage_ptr__->_M_string_length;
        strlen(local_1038);
        std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar9,(ulong)local_1038);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
    operator_delete(local_10d8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string searchFilenameInRpaths(const std::string& rpath_file, const std::string& dependent_file)
{
    char buffer[PATH_MAX];
    std::string fullpath;
    std::string suffix = std::regex_replace(rpath_file, std::regex("^@[a-z_]+path/"), "");

    const auto check_path = [&](std::string path)
    {
        char buffer[PATH_MAX];
        std::string file_prefix = dependent_file.substr(0, dependent_file.rfind('/')+1);
        if (dependent_file != rpath_file)
        {
            std::string path_to_check;
            if (path.find("@loader_path") != std::string::npos)
            {
                path_to_check = std::regex_replace(path, std::regex("@loader_path/"), file_prefix);
            }
            else if (path.find("@rpath") != std::string::npos)
            {
                path_to_check = std::regex_replace(path, std::regex("@rpath/"), file_prefix);
            }
            if (realpath(path_to_check.c_str(), buffer))
            {
                fullpath = buffer;
                rpath_to_fullpath[rpath_file] = fullpath;
                return true;
            }
        }
        return false;
    };

    // fullpath previously stored
    if (rpath_to_fullpath.find(rpath_file) != rpath_to_fullpath.end())
    {
        fullpath = rpath_to_fullpath[rpath_file];
    }
    else if (!check_path(rpath_file))
    {
        for (auto rpath : rpaths_per_file[dependent_file])
        {
            if (rpath[rpath.size()-1] != '/') rpath += "/";
            if (check_path(rpath+suffix)) break;
        }
        if (rpath_to_fullpath.find(rpath_file) != rpath_to_fullpath.end())
        {
            fullpath = rpath_to_fullpath[rpath_file];
        }
    }

    if (fullpath.empty())
    {
        const int searchPathAmount = Settings::searchPathAmount();
        for (int n=0; n<searchPathAmount; n++)
        {
            std::string search_path = Settings::searchPath(n);
            if (fileExists(search_path+suffix))
            {
                fullpath = search_path + suffix;
                break;
            }
        }

        if (fullpath.empty())
        {
            std::cerr << "\n/!\\ WARNING : can't get path for '" << rpath_file << "'\n";
            fullpath = getUserInputDirForFile(suffix) + suffix;
            if (realpath(fullpath.c_str(), buffer))
            {
                fullpath = buffer;
            }
        }
    }

    return fullpath;
}